

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h263d_vdpu2.c
# Opt level: O3

MPP_RET hal_vpu2_h263d_gen_regs(void *hal,HalTaskInfo *syn)

{
  undefined4 uVar1;
  void *pvVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  MppBuffer buf_pkt;
  MppBuffer buf_frm_ref0;
  MppBuffer buf_frm_curr;
  MppBuffer local_50;
  long local_48;
  MppBuffer local_40;
  MppBuffer local_38;
  
  local_38 = (MppBuffer)0x0;
  local_40 = (MppBuffer)0x0;
  local_50 = (MppBuffer)0x0;
  pvVar2 = *(void **)((long)hal + 0x88);
  if (((((syn->dec).valid == 0) &&
       (_mpp_log_l(2,"hal_vpu_h263d","Assertion %s failed at %s:%d\n",(char *)0x0,"task->valid",
                   "hal_vpu2_h263d_gen_regs",0xbe), (mpp_debug._3_1_ & 0x10) != 0)) ||
      (((syn->dec).input < 0 &&
       (_mpp_log_l(2,"hal_vpu_h263d","Assertion %s failed at %s:%d\n",(char *)0x0,"task->input >= 0"
                   ,"hal_vpu2_h263d_gen_regs",0xbf), (mpp_debug._3_1_ & 0x10) != 0)))) ||
     (((syn->dec).output < 0 &&
      (_mpp_log_l(2,"hal_vpu_h263d","Assertion %s failed at %s:%d\n",(char *)0x0,"task->output >= 0"
                  ,"hal_vpu2_h263d_gen_regs",0xc0), (mpp_debug._3_1_ & 0x10) != 0))))
  goto LAB_001eb401;
  memset(pvVar2,0,0x27c);
  *(undefined4 *)((long)pvVar2 + 0xd8) = 0x3f;
  *(undefined8 *)((long)pvVar2 + 0xe0) = 0x3100100000;
  *(undefined4 *)((long)pvVar2 + 0xd0) = 0x20000;
  *(undefined4 *)((long)pvVar2 + 0xec) = 0xffc03fe8;
  *(undefined4 *)((long)pvVar2 + 0x264) = 0x5000000;
  mpp_buf_slot_get_prop(*(MppBufSlots *)((long)hal + 0x60),(syn->dec).input,SLOT_BUFFER,&local_50);
  if ((local_50 == (MppBuffer)0x0) &&
     (_mpp_log_l(2,"hal_vpu_h263d","Assertion %s failed at %s:%d\n",(char *)0x0,"buf_pkt",
                 "hal_vpu2_h263d_gen_regs",0xd9), (mpp_debug._3_1_ & 0x10) != 0)) goto LAB_001eb401;
  vpu_h263d_get_buffer_by_index((hal_h263_ctx *)hal,(syn->dec).output,&local_38);
  vpu_h263d_get_buffer_by_index((hal_h263_ctx *)hal,(syn->dec).refer[0],&local_40);
  iVar4 = mpp_buffer_get_fd_with_caller(local_38,"hal_vpu2_h263d_gen_regs");
  *(int *)((long)hal + 0x7c) = iVar4;
  if (local_40 == (MppBuffer)0x0) {
    iVar5 = -1;
  }
  else {
    iVar5 = mpp_buffer_get_fd_with_caller(local_40,"hal_vpu2_h263d_gen_regs");
    iVar4 = *(int *)((long)hal + 0x7c);
  }
  *(int *)((long)hal + 0x80) = iVar5;
  *(int *)((long)pvVar2 + 0xfc) = iVar4;
  iVar4 = mpp_buffer_get_fd_with_caller(local_50,"hal_vpu2_h263d_gen_regs");
  *(int *)((long)pvVar2 + 0x100) = iVar4;
  uVar14 = (ulong)(syn->dec).syntax.number;
  if (uVar14 == 0) {
    iVar4 = 0;
    uVar10 = 0;
    lVar12 = *(long *)((long)hal + 0x88);
LAB_001eb165:
    lVar11 = 0;
    _mpp_log_l(2,"hal_vpu_h263d","Assertion %s failed at %s:%d\n",(char *)0x0,"pp",
               "vpu2_h263d_setup_regs_by_syntax",0x39);
    if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_001eb401;
  }
  else {
    pvVar2 = (syn->dec).syntax.data;
    uVar13 = 0;
    lVar11 = 0;
    iVar4 = 0;
    uVar10 = 0;
    local_48 = *(long *)((long)hal + 0x88);
    do {
      piVar3 = *(int **)((long)pvVar2 + uVar13 * 8);
      if (*piVar3 == 6) {
        uVar10 = piVar3[2];
        iVar4 = piVar3[3];
      }
      else if (*piVar3 == 0) {
        lVar11 = *(long *)(piVar3 + 10);
      }
      else {
        _mpp_log_l(2,"hal_vpu_h263d","found invalid buffer descriptor type %d\n",
                   "vpu2_h263d_setup_regs_by_syntax");
      }
      uVar13 = uVar13 + 1;
    } while (uVar14 != uVar13);
    lVar12 = local_48;
    if (lVar11 == 0) goto LAB_001eb165;
  }
  if (((iVar4 == 0) &&
      (_mpp_log_l(2,"hal_vpu_h263d","Assertion %s failed at %s:%d\n",(char *)0x0,"stream_length",
                  "vpu2_h263d_setup_regs_by_syntax",0x3a), (mpp_debug._3_1_ & 0x10) != 0)) ||
     ((uVar10 == 0 &&
      (_mpp_log_l(2,"hal_vpu_h263d","Assertion %s failed at %s:%d\n",(char *)0x0,"stream_used",
                  "vpu2_h263d_setup_regs_by_syntax",0x3b), (mpp_debug._3_1_ & 0x10) != 0)))) {
LAB_001eb401:
    abort();
  }
  uVar7 = *(int *)(lVar11 + 0x24) * 0x80000 + 0x780000U & 0xff800000;
  uVar6 = *(uint *)(lVar12 + 0x1e0);
  *(uint *)(lVar12 + 0x1e0) = uVar6 & 0x7fffff | uVar7;
  uVar8 = (uint)*(ushort *)(lVar11 + 0x26) * 0x80 + 0x780 & 0x7f800;
  *(uint *)(lVar12 + 0x1e0) = uVar6 & 0x7807ff | uVar7 | uVar8;
  uVar9 = (*(ushort *)(lVar11 + 0x24) & 0xf) << 0x13;
  *(uint *)(lVar12 + 0x1e0) = uVar6 & 0x7ff | uVar7 | uVar8 | uVar9;
  *(uint *)(lVar12 + 0x1e0) =
       uVar6 & 0x7f | uVar7 | uVar8 | uVar9 | (*(ushort *)(lVar11 + 0x26) & 0xf) << 7;
  *(undefined4 *)(lVar12 + 0xd4) = 2;
  *(byte *)(lVar12 + 0xc9) = *(byte *)(lVar12 + 0xc9) | 1;
  *(byte *)(lVar12 + 0x220) = *(byte *)(lVar12 + 0x220) & 0xfd;
  uVar6 = *(uint *)(lVar12 + 0xcc) & 0x81ffffff | (*(byte *)(lVar11 + 2) & 0x3f) << 0x19;
  *(uint *)(lVar12 + 0xcc) = uVar6;
  uVar7 = *(uint *)(lVar12 + 0x1e8) | 0x2000000;
  *(uint *)(lVar12 + 0x1e8) = uVar7;
  uVar1 = *(undefined4 *)(lVar12 + 0x100);
  uVar8 = uVar10 >> 3 & 0xfffffff8;
  if (uVar8 != 0) {
    mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x70),0x40,uVar8);
    uVar6 = *(uint *)(lVar12 + 0xcc);
    uVar7 = *(uint *)(lVar12 + 0x1e8);
  }
  *(undefined4 *)(lVar12 + 0x100) = uVar1;
  uVar10 = uVar7 & 0x3ffffff | uVar10 << 0x1a;
  *(uint *)(lVar12 + 0x1e8) = uVar10;
  *(uint *)(lVar12 + 0xcc) = uVar6 & 0xff000000 | iVar4 - uVar8 & 0xffffff;
  *(uint *)(lVar12 + 0x1e8) = CONCAT22((short)(uVar10 >> 0x10),*(undefined2 *)(lVar11 + 0xc));
  if (*(char *)(lVar11 + 1) == '\0') {
    *(byte *)(lVar12 + 0xe5) = *(byte *)(lVar12 + 0xe5) & 0xbf;
LAB_001eb3ae:
    iVar4 = *(int *)((long)hal + 0x7c);
  }
  else {
    if (*(char *)(lVar11 + 1) != '\x01') goto LAB_001eb3bf;
    *(byte *)(lVar12 + 0xe5) = *(byte *)(lVar12 + 0xe5) | 0x40;
    iVar4 = *(int *)((long)hal + 0x80);
    if (iVar4 < 0) goto LAB_001eb3ae;
  }
  *(int *)(lVar12 + 0x20c) = iVar4;
  *(int *)(lVar12 + 0x250) = iVar4;
LAB_001eb3bf:
  uVar10 = *(uint *)(lVar12 + 0x220);
  *(uint *)(lVar12 + 0x220) = uVar10 & 0xfff807ff | 0x8800;
  *(uint *)(lVar12 + 0x220) = uVar10 & 0xfff807fe | 0x8800 | (uint)(*(int *)(lVar11 + 0x44) == 1);
  return MPP_OK;
}

Assistant:

MPP_RET hal_vpu2_h263d_gen_regs(void *hal,  HalTaskInfo *syn)
{
    MPP_RET ret = MPP_OK;
    hal_h263_ctx *ctx = (hal_h263_ctx *)hal;
    HalDecTask *task = &syn->dec;
    MppBuffer buf_frm_curr = NULL;
    MppBuffer buf_frm_ref0 = NULL;
    MppBuffer buf_pkt = NULL;
    Vpu2H263dRegSet_t *regs = (Vpu2H263dRegSet_t*)ctx->regs;

    mpp_assert(task->valid);
    mpp_assert(task->input >= 0);
    mpp_assert(task->output >= 0);

    memset(regs, 0, sizeof(Vpu2H263dRegSet_t));

    /*
     * basic register configuration setup here
     */
    regs->reg54_endian.sw_dec_out_endian = 1;
    regs->reg54_endian.sw_dec_in_endian = 1;
    regs->reg54_endian.sw_dec_inswap32_e = 1;
    regs->reg54_endian.sw_dec_outswap32_e = 1;
    regs->reg54_endian.sw_dec_strswap32_e = 1;
    regs->reg54_endian.sw_dec_strendian_e = 1;
    regs->reg56_axi_ctrl.sw_dec_max_burst = 16;
    regs->reg52_error_concealment.sw_apf_threshold = 1;
    regs->reg57_enable_ctrl.sw_dec_timeout_e = 1;
    regs->reg57_enable_ctrl.sw_dec_clk_gate_e = 1;
    regs->reg57_enable_ctrl.sw_dec_e = 1;
    regs->reg59.sw_pred_bc_tap_0_0 = -1;
    regs->reg59.sw_pred_bc_tap_0_1 = 3;
    regs->reg59.sw_pred_bc_tap_0_2 = -6;
    regs->reg153.sw_pred_bc_tap_0_3 = 20;

    /* setup buffer for input / output / reference */
    mpp_buf_slot_get_prop(ctx->pkt_slots, task->input, SLOT_BUFFER, &buf_pkt);
    mpp_assert(buf_pkt);
    vpu_h263d_get_buffer_by_index(ctx, task->output, &buf_frm_curr);
    vpu_h263d_get_buffer_by_index(ctx, task->refer[0], &buf_frm_ref0);

    /* address registers setup first */
    ctx->fd_curr = mpp_buffer_get_fd(buf_frm_curr);
    ctx->fd_ref0 = (buf_frm_ref0) ? (mpp_buffer_get_fd(buf_frm_ref0)) : (-1);
    regs->reg63_cur_pic_base = (RK_U32)ctx->fd_curr;
    regs->reg64_input_stream_base = mpp_buffer_get_fd(buf_pkt);

    /* setup other registers, here will update packet address */
    vpu2_h263d_setup_regs_by_syntax(ctx, task->syntax);

    return ret;
}